

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_br3p86.c
# Opt level: O3

void br3p86_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  dVar4 = get_ext_param(p,ext_params,2);
  p->cam_alpha = dVar2;
  pdVar1 = p->mix_coef;
  *pdVar1 = (1.0 - dVar2) - dVar3;
  pdVar1[1] = dVar3;
  pdVar1[2] = 1.0 - dVar4;
  pdVar1[3] = dVar4;
  return;
}

Assistant:

static void
br3p86_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a, b, c;

  assert(p != NULL);

  a = get_ext_param(p, ext_params, 0);
  b = get_ext_param(p, ext_params, 1);
  c = get_ext_param(p, ext_params, 2);

  p->cam_alpha = a;

  p->mix_coef[0] = 1.0 - a - b;
  p->mix_coef[1] = b;
  p->mix_coef[2] = 1.0 - c;
  p->mix_coef[3] = c;
}